

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O0

void animation_timer_method_proc(Am_Object *inter,Am_Time *elapsed_time)

{
  Am_Value *in_value;
  Am_Value local_48 [2];
  undefined1 local_28 [8];
  Am_Value value;
  Am_Time *elapsed_time_local;
  Am_Object *inter_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)elapsed_time;
  Am_Value::Am_Value((Am_Value *)local_28);
  in_value = Am_Object::Peek(inter,0xc5,0);
  Am_Value::operator=((Am_Value *)local_28,in_value);
  Am_Value::Am_Value(local_48,(Am_Value *)local_28);
  call_all_commands(local_48,200,inter,(Am_Time *)value.value.wrapper_value,false);
  Am_Value::~Am_Value(local_48);
  Am_Value::~Am_Value((Am_Value *)local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, animation_timer_method,
                 (Am_Object inter, const Am_Time &elapsed_time))
{
  Am_Value value;
  value = inter.Peek(Am_COMMAND);
  call_all_commands(value, Am_INTERIM_DO_METHOD, inter, elapsed_time, false);
}